

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O2

char * google::protobuf::internal::VarintParse<unsigned_long>(char *p,unsigned_long *out)

{
  byte bVar1;
  char *pcVar2;
  uint res32;
  pair<const_char_*,_unsigned_long> pVar3;
  
  bVar1 = *p;
  if ((long)(char)bVar1 < 0) {
    res32 = ((uint)(byte)p[1] * 0x80 + (uint)bVar1) - 0x80;
    if (p[1] < '\0') {
      pVar3 = VarintParseSlow64(p,res32);
      pcVar2 = pVar3.first;
      *out = pVar3.second;
    }
    else {
      *out = (ulong)res32;
      pcVar2 = p + 2;
    }
  }
  else {
    *out = (long)(char)bVar1;
    pcVar2 = p + 1;
  }
  return pcVar2;
}

Assistant:

PROTOBUF_NODISCARD const char* VarintParse(const char* p, T* out) {
  auto ptr = reinterpret_cast<const uint8_t*>(p);
  uint32_t res = ptr[0];
  if (!(res & 0x80)) {
    *out = res;
    return p + 1;
  }
  uint32_t byte = ptr[1];
  res += (byte - 1) << 7;
  if (!(byte & 0x80)) {
    *out = res;
    return p + 2;
  }
  return VarintParseSlow(p, res, out);
}